

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenConstSetValueI64High(BinaryenExpressionRef expr,int32_t valueHigh)

{
  ulong uVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xadf,"void BinaryenConstSetValueI64High(BinaryenExpressionRef, int32_t)");
  }
  if (*(long *)(expr + 2) == 3) {
    if (*(long *)(expr + 2) != 3) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    uVar1 = (ulong)(uint)(((Literal *)(expr + 1))->field_0).i32;
  }
  else {
    uVar1 = 0;
  }
  local_28.func.super_IString.str._M_len = (ulong)(uint)valueHigh << 0x20 | uVar1;
  local_18 = 3;
  wasm::Literal::operator=((Literal *)(expr + 1),(Literal *)&local_28.func);
  wasm::Literal::~Literal((Literal *)&local_28.func);
  return;
}

Assistant:

void BinaryenConstSetValueI64High(BinaryenExpressionRef expr,
                                  int32_t valueHigh) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  auto& value = static_cast<Const*>(expression)->value;
  int64_t valueI64 = value.type == Type::i64 ? value.geti64() : 0;
  static_cast<Const*>(expression)->value =
    Literal((int64_t(valueHigh) << 32) | (valueI64 & 0xffffffff));
}